

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O1

QSize __thiscall QtMWidgets::DateTimePicker::sizeHint(DateTimePicker *this)

{
  QArrayData *pQVar1;
  int iVar2;
  int extraout_var;
  DateTimePickerPrivate *pDVar3;
  reference pSVar4;
  int extraout_var_00;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  long i;
  QByteArrayView QVar9;
  QStyleOption opt;
  QArrayData *local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  QStyleOption local_70 [32];
  QString local_50;
  
  QStyleOption::QStyleOption(local_70,1,0);
  QStyleOption::initFrom((QWidget *)local_70);
  QVar9.m_data = (storage_type *)0x2;
  QVar9.m_size = (qsizetype)&local_88;
  QString::fromLatin1(QVar9);
  pQVar1 = local_88;
  uStack_78 = 0;
  local_80 = 0;
  local_88 = (QArrayData *)0x0;
  QFontMetrics::boundingRect(&local_50);
  ((this->d).d)->itemHeight = (extraout_var_00 - extraout_var) + 1;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,8);
    }
  }
  pDVar3 = (this->d).d;
  iVar2 = pDVar3->itemHeight;
  pDVar3->itemTopMargin = iVar2 / 3;
  iVar5 = (pDVar3->itemsMaxCount + -1) * (iVar2 / 3) + pDVar3->itemsMaxCount * iVar2;
  pDVar3->widgetHeight = iVar5;
  pDVar3->currentItemY = iVar5 / 2 - iVar2 / 2;
  pDVar3 = (this->d).d;
  uVar7 = 0;
  if (0 < (pDVar3->super_DateTimeParser).sections.d.size) {
    lVar8 = 0;
    i = 0;
    do {
      iVar2 = Section::maxWidth((Section *)
                                ((long)&((pDVar3->super_DateTimeParser).sections.d.ptr)->type +
                                lVar8),local_70);
      pSVar4 = QList<QtMWidgets::Section>::operator[]
                         (&(((this->d).d)->super_DateTimeParser).sections,i);
      pSVar4->sectionWidth = iVar2;
      pDVar3 = (this->d).d;
      iVar2 = pDVar3->itemSideMargin;
      pSVar4 = QList<QtMWidgets::Section>::operator[](&(pDVar3->super_DateTimeParser).sections,i);
      pSVar4->sectionWidth = pSVar4->sectionWidth + iVar2 * 2 + 6;
      pSVar4 = QList<QtMWidgets::Section>::operator[]
                         (&(((this->d).d)->super_DateTimeParser).sections,i);
      uVar6 = (int)uVar7 + pSVar4->sectionWidth;
      uVar7 = (ulong)uVar6;
      i = i + 1;
      pDVar3 = (this->d).d;
      lVar8 = lVar8 + 0x30;
    } while (i < (pDVar3->super_DateTimeParser).sections.d.size);
    uVar7 = (ulong)uVar6;
  }
  uVar6 = pDVar3->widgetHeight;
  QStyleOption::~QStyleOption(local_70);
  return (QSize)((ulong)uVar6 << 0x20 | uVar7);
}

Assistant:

QSize
DateTimePicker::sizeHint() const
{
	QStyleOption opt;
	opt.initFrom( this );

	d->itemHeight = opt.fontMetrics.boundingRect( QLatin1String( "AM" ) )
		.height();

	d->itemTopMargin = d->itemHeight / 3;

	d->widgetHeight = d->itemHeight * d->itemsMaxCount +
		( d->itemsMaxCount - 1 ) * d->itemTopMargin;

	d->currentItemY = d->widgetHeight / 2 - d->itemHeight / 2;

	int widgetWidth = 0;

	for( int i = 0; i < d->sections.size(); ++i )
	{
		d->sections[ i ].sectionWidth = d->sections.at( i ).maxWidth( opt );
		d->sections[ i ].sectionWidth += d->itemSideMargin * 2 + 6;
		widgetWidth += d->sections[ i ].sectionWidth;
	}

	return QSize( widgetWidth, d->widgetHeight );
}